

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
LargeGapGrayCode::createTransitionSequenceTheorem1
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,LargeGapGrayCode *this,int n,
          int m,vector<char,_std::allocator<char>_> *Z)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  int local_7c;
  int local_78;
  int i;
  int idxB;
  int idxA;
  vector<int,_std::allocator<int>_> B;
  vector<int,_std::allocator<int>_> A;
  allocator<int> local_2a;
  byte local_29;
  vector<char,_std::allocator<char>_> *local_28;
  vector<char,_std::allocator<char>_> *Z_local;
  int m_local;
  int n_local;
  LargeGapGrayCode *this_local;
  vector<int,_std::allocator<int>_> *tmp;
  
  local_29 = 0;
  local_28 = Z;
  Z_local._0_4_ = m;
  Z_local._4_4_ = n;
  _m_local = this;
  this_local = (LargeGapGrayCode *)__return_storage_ptr__;
  sVar3 = std::vector<char,_std::allocator<char>_>::size(Z);
  std::allocator<int>::allocator(&local_2a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,sVar3,&local_2a);
  std::allocator<int>::~allocator(&local_2a);
  pvVar4 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&this->m_transitionSequences,(long)(Z_local._4_4_ + -1));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &B.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,pvVar4);
  pvVar4 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&this->m_transitionSequences,(long)((int)Z_local + -1));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&idxB,pvVar4);
  i = 0;
  local_78 = 0;
  for (local_7c = 0; sVar3 = std::vector<char,_std::allocator<char>_>::size(local_28),
      (ulong)(long)local_7c < sVar3; local_7c = local_7c + 1) {
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](local_28,(long)local_7c);
    if (*pvVar5 == 'a') {
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         &B.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &B.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(long)i % sVar3);
      vVar1 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (__return_storage_ptr__,(long)local_7c);
      *pvVar6 = vVar1;
      i = i + 1;
    }
    else {
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](local_28,(long)local_7c);
      if (*pvVar5 == 'b') {
        sVar3 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&idxB);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&idxB,(ulong)(long)local_78 % sVar3
                           );
        iVar2 = *pvVar6 + Z_local._4_4_;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (__return_storage_ptr__,(long)local_7c);
        *pvVar6 = iVar2;
        local_78 = local_78 + 1;
      }
    }
  }
  local_29 = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&idxB);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &B.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  if ((local_29 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> LargeGapGrayCode::createTransitionSequenceTheorem1(int n, int m, const std::vector<char>& Z)
{
	std::vector<int> tmp(Z.size());

	std::vector<int> A = m_transitionSequences[n-1];
	std::vector<int> B = m_transitionSequences[m-1];
	int idxA = 0;
	int idxB = 0;

	for(int i = 0; i < Z.size(); i++)
    	{
		if(Z[i] == 'a') {
			tmp[i] = A[idxA++ % A.size()];
		}
		else if(Z[i] == 'b') {
			tmp[i] = B[idxB++ % B.size()] + n;
		}
    	}
	return tmp;
}